

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3SetJoinExpr(Expr *p,int iTable,u32 joinFlag)

{
  ExprList *pEVar1;
  long lVar2;
  int i;
  long lVar3;
  
  for (; p != (Expr *)0x0; p = p->pRight) {
    p->flags = p->flags | joinFlag;
    (p->w).iJoin = iTable;
    if ((p->op == 0xac) && (pEVar1 = (p->x).pList, pEVar1 != (ExprList *)0x0)) {
      lVar2 = 8;
      for (lVar3 = 0; lVar3 < pEVar1->nExpr; lVar3 = lVar3 + 1) {
        sqlite3SetJoinExpr(*(Expr **)((long)pEVar1->a + lVar2 + -8),iTable,joinFlag);
        pEVar1 = (p->x).pList;
        lVar2 = lVar2 + 0x18;
      }
    }
    sqlite3SetJoinExpr(p->pLeft,iTable,joinFlag);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SetJoinExpr(Expr *p, int iTable, u32 joinFlag){
  assert( joinFlag==EP_OuterON || joinFlag==EP_InnerON );
  while( p ){
    ExprSetProperty(p, joinFlag);
    assert( !ExprHasProperty(p, EP_TokenOnly|EP_Reduced) );
    ExprSetVVAProperty(p, EP_NoReduce);
    p->w.iJoin = iTable;
    if( p->op==TK_FUNCTION ){
      assert( ExprUseXList(p) );
      if( p->x.pList ){
        int i;
        for(i=0; i<p->x.pList->nExpr; i++){
          sqlite3SetJoinExpr(p->x.pList->a[i].pExpr, iTable, joinFlag);
        }
      }
    }
    sqlite3SetJoinExpr(p->pLeft, iTable, joinFlag);
    p = p->pRight;
  }
}